

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Model::InternalSwap(Model *this,Model *other)

{
  uint32_t uVar1;
  intptr_t iVar2;
  TypeUnion TVar3;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  google::protobuf::internal::memswap<13>((char *)&this->description_,(char *)&other->description_);
  TVar3 = this->Type_;
  this->Type_ = other->Type_;
  other->Type_ = TVar3;
  uVar1 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar1;
  return;
}

Assistant:

void Model::InternalSwap(Model* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(Model, isupdatable_)
      + sizeof(Model::isupdatable_)
      - PROTOBUF_FIELD_OFFSET(Model, description_)>(
          reinterpret_cast<char*>(&description_),
          reinterpret_cast<char*>(&other->description_));
  swap(Type_, other->Type_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}